

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_function_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSContext *ctx_00;
  int iVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  JSContext *pJVar7;
  ulong uVar8;
  long lVar9;
  int64_t iVar10;
  JSRefCountHeader *p;
  JSRefCountHeader *p_1;
  uint uVar11;
  JSValue obj;
  JSValue func_obj;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue v;
  JSValue proto_val;
  JSValue this_obj;
  int local_70;
  StringBuffer local_68;
  uint local_44;
  JSValueUnion local_40;
  JSContext *local_38;
  
  obj.tag = new_target.tag;
  local_40 = new_target.u;
  local_68.len = 0;
  local_68.size = 0;
  local_68.is_wide_char = 0;
  local_68.error_status = 0;
  local_68.ctx = ctx;
  local_68.str = js_alloc_string(ctx,0,0);
  if (local_68.str == (JSString *)0x0) {
    local_68._16_8_ = local_68._16_8_ & 0xffffffff;
    local_68.error_status = -1;
  }
  string_buffer_putc8(&local_68,0x28);
  if ((magic & 0xfffffffeU) == 2) {
    string_buffer_write8(&local_68,(uint8_t *)"async ",6);
  }
  local_38 = ctx;
  string_buffer_write8(&local_68,"function",8);
  local_44 = magic;
  if ((magic & 0xfffffffdU) == 1) {
    string_buffer_putc8(&local_68,0x2a);
  }
  string_buffer_write8(&local_68,(uint8_t *)" anonymous(",0xb);
  uVar5 = (ulong)(argc - 1);
  if (1 < argc) {
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        string_buffer_putc8(&local_68,0x2c);
      }
      JVar12.tag = *(int64_t *)((long)&argv->tag + lVar9);
      JVar12.u.ptr = ((JSValueUnion *)((long)&argv->u + lVar9))->ptr;
      iVar4 = string_buffer_concat_value(&local_68,JVar12);
      if (iVar4 != 0) goto LAB_0012fe8e;
      lVar9 = lVar9 + 0x10;
    } while (uVar5 << 4 != lVar9);
  }
  string_buffer_write8(&local_68,(uint8_t *)"\n) {\n",5);
  if (0 < argc) {
    JVar13.tag = argv[uVar5].tag;
    JVar13.u.ptr = argv[uVar5].u.ptr;
    iVar4 = string_buffer_concat_value(&local_68,JVar13);
    if (iVar4 != 0) {
LAB_0012fe8e:
      (*((local_68.ctx)->rt->mf).js_free)(&(local_68.ctx)->rt->malloc_state,local_68.str);
      iVar10 = 6;
      uVar5 = 0;
      uVar8 = 0;
      goto LAB_0012ff6f;
    }
  }
  string_buffer_write8(&local_68,(uint8_t *)"\n})",3);
  JVar12 = string_buffer_end(&local_68);
  ctx_00 = local_38;
  if ((uint)JVar12.tag != 6) {
    JVar13 = JS_EvalObject(local_38,local_38->global_obj,JVar12,3,-1);
    iVar10 = JVar13.tag;
    JVar6 = JVar13.u;
    if ((0xfffffff4 < (uint)JVar12.tag) &&
       (iVar4 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx_00->rt,JVar12);
    }
    if ((uint)JVar13.tag == 6) goto LAB_0012ff42;
    local_70 = (int)new_target.tag;
    if (local_70 == 3) {
LAB_00130093:
      uVar8 = (ulong)JVar6.ptr & 0xffffffff00000000;
      uVar5 = (ulong)JVar6.ptr & 0xffffffff;
      goto LAB_0012ff6f;
    }
    obj.u.ptr = local_40.ptr;
    this_obj.tag = obj.tag;
    this_obj.u.ptr = local_40.ptr;
    v = JS_GetPropertyInternal(ctx_00,obj,0x3b,this_obj,0);
    uVar11 = (uint)v.tag;
    if (uVar11 == 0xffffffff) {
LAB_00130032:
      iVar4 = JS_SetPrototypeInternal(ctx_00,JVar13,v,1);
      iVar1 = *v.u.ptr;
      *(int *)v.u.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        __JS_FreeValueRT(ctx_00->rt,v);
      }
LAB_0013008b:
      if (-1 < iVar4) goto LAB_00130093;
    }
    else if (uVar11 != 6) {
      if ((0xfffffff4 < uVar11) && (iVar4 = *v.u.ptr, *(int *)v.u.ptr = iVar4 + -1, iVar4 < 2)) {
        __JS_FreeValueRT(ctx_00->rt,v);
      }
      func_obj.tag = obj.tag;
      func_obj.u.ptr = local_40.ptr;
      pJVar7 = JS_GetFunctionRealm(ctx_00,func_obj);
      if (pJVar7 != (JSContext *)0x0) {
        JVar2 = (JSValueUnion)pJVar7->class_proto[func_kind_to_class_id[local_44]].u.ptr;
        iVar3 = pJVar7->class_proto[func_kind_to_class_id[local_44]].tag;
        v.tag = iVar3;
        v.u.ptr = JVar2.ptr;
        if (0xfffffff4 < (uint)iVar3) {
          *(int *)JVar2.ptr = *JVar2.ptr + 1;
          goto LAB_00130032;
        }
        proto_val.tag = iVar3;
        proto_val.u.ptr = JVar2.ptr;
        iVar4 = JS_SetPrototypeInternal(ctx_00,JVar13,proto_val,1);
        goto LAB_0013008b;
      }
    }
LAB_0012ff42:
    if ((0xfffffff4 < (uint)JVar13.tag) &&
       (iVar4 = *JVar6.ptr, *(int *)JVar6.ptr = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx_00->rt,JVar13);
    }
  }
  uVar5 = 0;
  uVar8 = 0;
  iVar10 = 6;
LAB_0012ff6f:
  JVar14.u.ptr = (void *)(uVar5 | uVar8);
  JVar14.tag = iVar10;
  return JVar14;
}

Assistant:

static JSValue js_function_constructor(JSContext *ctx, JSValueConst new_target,
                                       int argc, JSValueConst *argv, int magic)
{
    JSFunctionKindEnum func_kind = magic;
    int i, n, ret;
    JSValue s, proto, obj = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;

    string_buffer_init(ctx, b, 0);
    string_buffer_putc8(b, '(');
    
    if (func_kind == JS_FUNC_ASYNC || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_puts8(b, "async ");
    }
    string_buffer_puts8(b, "function");

    if (func_kind == JS_FUNC_GENERATOR || func_kind == JS_FUNC_ASYNC_GENERATOR) {
        string_buffer_putc8(b, '*');
    }
    string_buffer_puts8(b, " anonymous(");

    n = argc - 1;
    for(i = 0; i < n; i++) {
        if (i != 0) {
            string_buffer_putc8(b, ',');
        }
        if (string_buffer_concat_value(b, argv[i]))
            goto fail;
    }
    string_buffer_puts8(b, "\n) {\n");
    if (n >= 0) {
        if (string_buffer_concat_value(b, argv[n]))
            goto fail;
    }
    string_buffer_puts8(b, "\n})");
    s = string_buffer_end(b);
    if (JS_IsException(s))
        goto fail1;

    obj = JS_EvalObject(ctx, ctx->global_obj, s, JS_EVAL_TYPE_INDIRECT, -1);
    JS_FreeValue(ctx, s);
    if (JS_IsException(obj))
        goto fail1;
    if (!JS_IsUndefined(new_target)) {
        /* set the prototype */
        proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
        if (JS_IsException(proto))
            goto fail1;
        if (!JS_IsObject(proto)) {
            JSContext *realm;
            JS_FreeValue(ctx, proto);
            realm = JS_GetFunctionRealm(ctx, new_target);
            if (!realm)
                goto fail1;
            proto = JS_DupValue(ctx, realm->class_proto[func_kind_to_class_id[func_kind]]);
        }
        ret = JS_SetPrototypeInternal(ctx, obj, proto, TRUE);
        JS_FreeValue(ctx, proto);
        if (ret < 0)
            goto fail1;
    }
    return obj;

 fail:
    string_buffer_free(b);
 fail1:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}